

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CudaThreads.cpp
# Opt level: O0

Value __thiscall xmrig::CudaThreads::toJSON(CudaThreads *this,Document *doc)

{
  bool bVar1;
  GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
  *in_RDX;
  undefined8 extraout_RDX;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *in_RDI;
  Value VVar2;
  CudaThread *thread;
  const_iterator __end1;
  const_iterator __begin1;
  vector<xmrig::CudaThread,_std::allocator<xmrig::CudaThread>_> *__range1;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *allocator;
  Value *out;
  undefined4 in_stack_ffffffffffffff78;
  Type in_stack_ffffffffffffff7c;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  local_68;
  reference local_58;
  CudaThread *local_50;
  __normal_iterator<const_xmrig::CudaThread_*,_std::vector<xmrig::CudaThread,_std::allocator<xmrig::CudaThread>_>_>
  local_48 [4];
  undefined1 local_21;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *local_20;
  
  local_20 = rapidjson::
             GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
             ::GetAllocator(in_RDX);
  local_21 = 0;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  GenericValue(in_RDI,in_stack_ffffffffffffff7c);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  SetArray(in_RDI);
  local_48[0]._M_current =
       (CudaThread *)
       std::vector<xmrig::CudaThread,_std::allocator<xmrig::CudaThread>_>::begin
                 ((vector<xmrig::CudaThread,_std::allocator<xmrig::CudaThread>_> *)
                  CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  local_50 = (CudaThread *)
             std::vector<xmrig::CudaThread,_std::allocator<xmrig::CudaThread>_>::end
                       ((vector<xmrig::CudaThread,_std::allocator<xmrig::CudaThread>_> *)
                        CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<const_xmrig::CudaThread_*,_std::vector<xmrig::CudaThread,_std::allocator<xmrig::CudaThread>_>_>
                             *)in_RDI,
                            (__normal_iterator<const_xmrig::CudaThread_*,_std::vector<xmrig::CudaThread,_std::allocator<xmrig::CudaThread>_>_>
                             *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78)), bVar1
        ) {
    local_58 = __gnu_cxx::
               __normal_iterator<const_xmrig::CudaThread_*,_std::vector<xmrig::CudaThread,_std::allocator<xmrig::CudaThread>_>_>
               ::operator*(local_48);
    CudaThread::toJSON(__end1._M_current,(Document *)thread);
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    PushBack(in_RDI,(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
             (MemoryPoolAllocator<rapidjson::CrtAllocator> *)0x2285f5);
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    ~GenericValue(&local_68);
    __gnu_cxx::
    __normal_iterator<const_xmrig::CudaThread_*,_std::vector<xmrig::CudaThread,_std::allocator<xmrig::CudaThread>_>_>
    ::operator++(local_48);
  }
  VVar2.data_.s.str = (Ch *)extraout_RDX;
  VVar2.data_.n = (Number)in_RDI;
  return (Value)VVar2.data_;
}

Assistant:

rapidjson::Value xmrig::CudaThreads::toJSON(rapidjson::Document &doc) const
{
    using namespace rapidjson;
    auto &allocator = doc.GetAllocator();

    Value out(kArrayType);

    out.SetArray();

    for (const CudaThread &thread : m_data) {
        out.PushBack(thread.toJSON(doc), allocator);
    }

    return out;
}